

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::path(path *this,string_type *source,format fmt)

{
  std::__cxx11::string::string((string *)this,(string *)source);
  postprocess_path_with_format(this,fmt);
  return;
}

Assistant:

GHC_INLINE path::path(string_type&& source, format fmt)
    : _path(std::move(source))
{
    postprocess_path_with_format(fmt);
}